

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_internal.c
# Opt level: O1

void bench_field_half(void *arg,int iters)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  ulong uVar9;
  ulong uVar11;
  undefined1 auVar10 [16];
  
  if (0 < iters) {
    lVar5 = *(long *)((long)arg + 0x40);
    lVar6 = *(long *)((long)arg + 0x48);
    lVar3 = *(long *)((long)arg + 0x50);
    lVar4 = *(long *)((long)arg + 0x58);
    uVar1 = *(ulong *)((long)arg + 0x60);
    do {
      uVar2 = -(ulong)((uint)lVar5 & 1);
      uVar1 = uVar1 + (uVar2 >> 0x10);
      auVar8._8_4_ = (int)uVar2;
      auVar8._0_8_ = uVar2;
      auVar8._12_4_ = (int)(uVar2 >> 0x20);
      uVar7 = (uVar2 >> 0xc) + lVar3;
      uVar9 = (auVar8._8_8_ >> 0xc) + lVar4;
      uVar11 = (uVar2 >> 0xc) + lVar6;
      auVar10._8_4_ = (int)uVar7;
      auVar10._0_8_ = uVar11;
      auVar10._12_4_ = (int)(uVar7 >> 0x20);
      lVar5 = ((uVar11 & 1) << 0x33) + ((uVar2 >> 0xc & 0xffffefffffc2f) + lVar5 >> 1);
      lVar6 = ((auVar10._8_8_ & 1) << 0x33) + (uVar11 >> 1);
      lVar3 = ((uVar9 & 1) << 0x33) + (uVar7 >> 1);
      lVar4 = ((uVar1 & 1) << 0x33) + (uVar9 >> 1);
      uVar1 = uVar1 >> 1;
      iters = iters + -1;
    } while (iters != 0);
    *(long *)((long)arg + 0x40) = lVar5;
    *(long *)((long)arg + 0x48) = lVar6;
    *(long *)((long)arg + 0x50) = lVar3;
    *(long *)((long)arg + 0x58) = lVar4;
    *(ulong *)((long)arg + 0x60) = uVar1;
  }
  return;
}

Assistant:

static void bench_field_half(void* arg, int iters) {
    int i;
    bench_inv *data = (bench_inv*)arg;

    for (i = 0; i < iters; i++) {
        secp256k1_fe_half(&data->fe[0]);
    }
}